

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_with_absolute_prefix_unittest.cc
# Opt level: O2

void Test_CleanImmediatelyWithAbsolutePrefix_logging::Run(void)

{
  FlagSaver fs;
  FlagSaver FStack_38;
  
  google::FlagSaver::FlagSaver(&FStack_38);
  RunTest();
  google::FlagSaver::~FlagSaver(&FStack_38);
  return;
}

Assistant:

TEST(CleanImmediatelyWithAbsolutePrefix, logging) {
  using namespace std::chrono_literals;
  google::EnableLogCleaner(0h);
  google::SetLogFilenameExtension(".barfoo");
  google::SetLogDestination(GLOG_INFO, "test_cleanup_");

  for (unsigned i = 0; i < 1000; ++i) {
    LOG(INFO) << "cleanup test";
  }

  for (unsigned i = 0; i < 10; ++i) {
    LOG(ERROR) << "cleanup test";
  }

  google::DisableLogCleaner();
}